

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_physfs.c
# Opt level: O2

int cmd_enumerate(char *args)

{
  size_t sVar1;
  long lVar2;
  undefined8 uVar3;
  char *pcVar4;
  ulong uVar5;
  
  pcVar4 = args;
  if (*args == '\"') {
    pcVar4 = args + 1;
    sVar1 = strlen(pcVar4);
    args[sVar1] = '\0';
  }
  lVar2 = PHYSFS_enumerateFiles(pcVar4);
  if (lVar2 == 0) {
    uVar3 = PHYSFS_getLastError();
    printf("Failure. reason: %s.\n",uVar3);
  }
  else {
    for (uVar5 = 0; pcVar4 = *(char **)(lVar2 + uVar5 * 8), pcVar4 != (char *)0x0; uVar5 = uVar5 + 1
        ) {
      puts(pcVar4);
    }
    printf("\n total (%d) files.\n",uVar5 & 0xffffffff);
    PHYSFS_freeList(lVar2);
  }
  return 1;
}

Assistant:

static int cmd_enumerate(char *args)
{
    char **rc;

    if (*args == '\"')
    {
        args++;
        args[strlen(args) - 1] = '\0';
    } /* if */

    rc = PHYSFS_enumerateFiles(args);

    if (rc == NULL)
        printf("Failure. reason: %s.\n", PHYSFS_getLastError());
    else
    {
        int file_count;
        char **i;
        for (i = rc, file_count = 0; *i != NULL; i++, file_count++)
            printf("%s\n", *i);

        printf("\n total (%d) files.\n", file_count);
        PHYSFS_freeList(rc);
    } /* else */

    return 1;
}